

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * simplify_minof(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  uint32_t uVar1;
  QueryType *pQVar2;
  vector<Query,_std::allocator<Query>_> *pvVar3;
  Query QStack_68;
  
  pQVar2 = Query::get_type(q);
  if (*pQVar2 == MIN_OF) {
    uVar1 = Query::as_count(q);
    pvVar3 = Query::as_queries(q);
    if (((long)(pvVar3->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start) / 0x48 == (ulong)uVar1) {
      *changed = true;
      pvVar3 = Query::as_queries(q);
      q_and(&QStack_68,pvVar3);
    }
    else {
      uVar1 = Query::as_count(q);
      if (uVar1 == 1) {
        *changed = true;
        pvVar3 = Query::as_queries(q);
        q_or(&QStack_68,pvVar3);
      }
      else {
        uVar1 = Query::as_count(q);
        if (uVar1 != 0) goto LAB_00165b85;
        *changed = true;
        q_everything();
      }
    }
    Query::Query(__return_storage_ptr__,&QStack_68);
    Query::~Query(&QStack_68);
  }
  else {
LAB_00165b85:
    Query::Query(__return_storage_ptr__,q);
  }
  return __return_storage_ptr__;
}

Assistant:

Query simplify_minof(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::MIN_OF) {
        if (q.as_count() == q.as_queries().size()) {
            *changed = true;
            return std::move(q_and(std::move(q.as_queries())));
        } else if (q.as_count() == 1) {
            *changed = true;
            return std::move(q_or(std::move(q.as_queries())));
        } else if (q.as_count() == 0) {
            *changed = true;
            return std::move(q_everything());
        }
    }
    return std::move(q);
}